

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRMiner.cpp
# Opt level: O2

void dgrminer::run_DGRMiner
               (string *input_file,string *output_file,double min_support,double min_confidence,
               bool compute_confidence,int window_size,string *str_timeabstraction,
               bool search_for_anomalies,double min_anomaly_outlierness,bool verbose,
               bool new_measures,bool heuristic_mis)

{
  PartialUnion pu_00;
  int max_absolute_support_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  size_t j;
  ulong uVar6;
  vector<int,_std::allocator<int>_> *graph_ids;
  ulong uVar7;
  double dVar8;
  undefined1 uVar9;
  undefined4 uStack_928;
  int min_absolute_support;
  int max_absolute_support;
  int snapshots;
  undefined4 uStack_914;
  FileReader fr;
  array<int,_10UL> i_p;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> initial_patterns;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> init_pattern;
  undefined8 uStack_870;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> newedges;
  undefined8 uStack_850;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> starting_edges;
  undefined8 uStack_830;
  vector<int,_std::allocator<int>_> antecedent_graph_ids;
  pointer puStack_810;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  initial_patterns_occurrences;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
  adjacency_lists;
  string local_7d8 [8];
  undefined1 in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff838;
  undefined1 in_stack_fffffffffffff840;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  edges_set;
  string local_788;
  _Rb_tree<dgrminer::labeled_node_time,_dgrminer::labeled_node_time,_std::_Identity<dgrminer::labeled_node_time>,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  local_768;
  string local_738 [32];
  PartialUnion pu;
  results_crate results;
  results_crate_anomalies results_anomalies;
  set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  labeled_nodes;
  PartialUnion local_300;
  PartialUnion local_198;
  
  bVar1 = std::operator==(str_timeabstraction,"bin_all");
  bVar2 = std::operator==(str_timeabstraction,"bin_nodes");
  memset(&results.result_nodes,0,0xa8);
  memset(&results_anomalies.anomaly_result_nodes,0,0x90);
  results.saved_instances = 0;
  results_anomalies.anomaly_saved_instances = 0;
  PartialUnion::PartialUnion(&pu);
  if (verbose) {
    println<char[22]>((char (*) [22])"--- STARTING DGRMINER");
    print<char[17]>((char (*) [17])"--- READING FILE");
  }
  std::__cxx11::string::string((string *)&local_788,(string *)input_file);
  FileReader::read_dynamic_graph_from_file
            ((PartialUnion *)&labeled_nodes,&fr,&local_788,window_size,search_for_anomalies);
  PartialUnion::operator=(&pu,(PartialUnion *)&labeled_nodes);
  PartialUnion::~PartialUnion((PartialUnion *)&labeled_nodes);
  std::__cxx11::string::~string((string *)&local_788);
  if (verbose) {
    println<char[7]>((char (*) [7])0x129832);
  }
  PartialUnion::printDimensions(&pu);
  labeled_nodes._M_t._M_impl._0_4_ = PartialUnion::getNumberOfDynamicGraphs(&pu);
  if (verbose) {
    println<char[27],int>((char (*) [27])"Number of dynamic graphs: ",(int *)&labeled_nodes);
  }
  PartialUnion::setNewMeasuresAndHeuristics(&pu,new_measures,heuristic_mis);
  iVar3 = PartialUnion::getNumberOfDynamicGraphs(&pu);
  iVar4 = PartialUnion::getNumberOfNodes(&pu);
  if (iVar4 == 0) {
    if (verbose) {
      println<char[42]>((char (*) [42])"The union graph has no nodes! Quitting...");
    }
    goto LAB_00105216;
  }
  max_absolute_support = PartialUnion::getNumberOfSnapshots(&pu);
  snapshots = max_absolute_support;
  if (1 < iVar3 && !new_measures) {
    iVar4 = PartialUnion::queryMappingSnapshotsToGraphs(&pu,max_absolute_support + -1);
    max_absolute_support = iVar4 + 1;
  }
  if (!new_measures) {
    min_support = min_support * (double)max_absolute_support;
  }
  dVar8 = ceil(min_support);
  min_absolute_support = (int)dVar8;
  if (verbose) {
    println<char[23],int>((char (*) [23])"Max absolute support: ",&max_absolute_support);
    println<char[22],int>((char (*) [22])"Number of snapshots: ",&snapshots);
    println<char[25],int>((char (*) [25])"Min support (absolute): ",&min_absolute_support);
  }
  if (bVar1) {
    PartialUnion::performSimpleTimeAbstraction(&pu);
  }
  else if (bVar2) {
    PartialUnion::performSimpleNodeTimeAbstraction(&pu);
  }
  if (verbose && !compute_confidence) {
    println<char[33]>((char (*) [33])"--- REMOVING INFREQUENT VERTICES");
  }
  PartialUnion::computeFrequentVerticesAndRemoveTheInfrequentOnes
            (&pu,min_absolute_support,min_confidence,compute_confidence,&results,&results_anomalies,
             max_absolute_support,1 < iVar3,search_for_anomalies,min_anomaly_outlierness);
  if (verbose && !compute_confidence) {
    println<char[11]>((char (*) [11])"--- (DONE)");
    println<char[27]>((char (*) [27])"--- REMOVING INVALID EDGES");
  }
  PartialUnion::compute_labeled_nodes(&labeled_nodes,&pu);
  if (!compute_confidence) {
    std::
    _Rb_tree<dgrminer::labeled_node_time,_dgrminer::labeled_node_time,_std::_Identity<dgrminer::labeled_node_time>,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
    ::_Rb_tree(&local_768,&labeled_nodes._M_t);
    PartialUnion::eraseInvalidEdges
              (&pu,(set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
                    *)&local_768);
    std::
    _Rb_tree<dgrminer::labeled_node_time,_dgrminer::labeled_node_time,_std::_Identity<dgrminer::labeled_node_time>,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
    ::~_Rb_tree(&local_768);
    if (verbose) {
      println<char[11]>((char (*) [11])"--- (DONE)");
      println<char[30]>((char (*) [30])"--- REMOVING INFREQUENT EDGES");
    }
  }
  newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &edges_set._M_t._M_impl.super__Rb_tree_header._M_header;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       edges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  PartialUnion::compute_labeled_edges(&pu,&newedges,&edges_set,&labeled_nodes,true);
  if (compute_confidence) {
    if (verbose) {
LAB_00104e19:
      print<char[30]>((char (*) [30])"--- BUILDING ADJACENCY LISTS ");
    }
  }
  else {
    PartialUnion::removeInfrequentEdges
              (&pu,&newedges,&edges_set,min_absolute_support,1 < iVar3,true);
    if (verbose) {
      println<char[11]>((char (*) [11])"--- (DONE)");
      goto LAB_00104e19;
    }
  }
  PartialUnion::createAdjacencyLists(&adjacency_lists,&pu,&newedges,snapshots);
  if (verbose) {
    println<char[7]>((char (*) [7])0x129832);
    print<char[30]>((char (*) [30])"--- GETTING INITIAL PATTERNS ");
  }
  initial_patterns.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initial_patterns.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  initial_patterns.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  initial_patterns_occurrences.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  initial_patterns_occurrences.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  initial_patterns_occurrences.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getFrequentInitialPatterns
            (&edges_set,&initial_patterns,&initial_patterns_occurrences,min_absolute_support,
             1 < iVar3,&pu);
  if (verbose) {
    println<char[7]>((char (*) [7])0x129832);
  }
  antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  for (i_p._M_elems[0] = 0; i_p._M_elems[0] < snapshots; i_p._M_elems[0] = i_p._M_elems[0] + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(&antecedent_graph_ids,i_p._M_elems);
  }
  i_p._M_elems[0] =
       (int)((long)initial_patterns.
                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)initial_patterns.
                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 5);
  i_p._M_elems[1] =
       (int)((long)initial_patterns.
                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)initial_patterns.
                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 0x25);
  if (verbose) {
    println<char[46],unsigned_long,char[20]>
              ((char (*) [46])"--- FINDING FREQUENT PATTERNS (STARTING FROM ",(unsigned_long *)&i_p,
               (char (*) [20])" INITIAL PATTERNS):");
    i_p._M_elems[0] =
         (int)((long)results.result_nodes.
                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)results.result_nodes.
                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    i_p._M_elems[1] =
         (int)((long)results.result_nodes.
                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)results.result_nodes.
                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 0x24);
    println<char[6],unsigned_long,char[39]>
              ((char (*) [6])"--- (",(unsigned_long *)&i_p,
               (char (*) [39])" SINGLE-VERTEX PATTERNS ALREADY FOUND)");
  }
  PartialUnion::PartialUnion(&local_300,&pu);
  std::__cxx11::string::string(local_7d8,(string *)output_file);
  printResultsToFiles(&results,&results_anomalies,&local_300,(string *)local_7d8,1 < iVar3,
                      compute_confidence,search_for_anomalies,false);
  std::__cxx11::string::~string(local_7d8);
  PartialUnion::~PartialUnion(&local_300);
  for (uVar7 = 0;
      uVar7 < (ulong)((long)initial_patterns.
                            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)initial_patterns.
                            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
    starting_edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    starting_edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    starting_edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar5 = 0;
    for (uVar6 = 0; uVar6 <= uVar7; uVar6 = uVar6 + 1) {
      std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                 &starting_edges.
                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,
                 (value_type *)
                 ((long)(initial_patterns.
                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar5));
      lVar5 = lVar5 + 0x20;
    }
    init_pattern.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    init_pattern.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    init_pattern.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    i_p._M_elems[0] = 0;
    i_p._M_elems[1] = 1;
    i_p._M_elems[2] =
         initial_patterns.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_start[uVar7]._M_elems[0];
    i_p._M_elems[3] =
         initial_patterns.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_start[uVar7]._M_elems[1];
    i_p._M_elems[4] =
         initial_patterns.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_start[uVar7]._M_elems[2];
    i_p._M_elems[5] =
         initial_patterns.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_start[uVar7]._M_elems[3];
    i_p._M_elems[6] =
         initial_patterns.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_start[uVar7]._M_elems[4];
    i_p._M_elems[7] =
         initial_patterns.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_start[uVar7]._M_elems[5];
    i_p._M_elems[8] =
         initial_patterns.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_start[uVar7]._M_elems[6];
    i_p._M_elems[9] =
         initial_patterns.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_start[uVar7]._M_elems[7];
    std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
              (&init_pattern,&i_p);
    max_absolute_support_00 = max_absolute_support;
    iVar4 = min_absolute_support;
    graph_ids = initial_patterns_occurrences.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar7;
    PartialUnion::PartialUnion(&local_198,&pu);
    uVar9 = 0;
    std::__cxx11::string::string(local_738,(string *)output_file);
    pu_00.nodes.super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&antecedent_graph_ids;
    pu_00._0_8_ = &local_198;
    pu_00.nodes.super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_1_ = 1 < iVar3;
    pu_00.nodes.super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    pu_00.nodes.super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = search_for_anomalies;
    pu_00.nodes.super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    pu_00.edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_738;
    pu_00.edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_1_ = verbose;
    pu_00.edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    pu_00.edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = new_measures;
    pu_00.edges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    pu_00.labelEncoding._M_t._M_impl._0_1_ = heuristic_mis;
    pu_00.labelEncoding._M_t._M_impl._1_7_ = 0;
    pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = uVar9;
    pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ = 0x1051;
    pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = uStack_928;
    pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = iVar3;
    pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ =
         min_absolute_support;
    pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ =
         max_absolute_support;
    pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = snapshots;
    pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = uStack_914;
    pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = compute_confidence;
    pu_00.labelEncoding._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_ = 0;
    pu_00.encodingLabel._M_t._M_impl._0_4_ = max_absolute_support_00;
    pu_00.encodingLabel._M_t._M_impl._4_4_ = 0;
    pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = verbose;
    pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ = 0;
    pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
         search_for_anomalies;
    pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_ = 0;
    pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = i_p._M_elems[0]
    ;
    pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ = i_p._M_elems[1]
    ;
    pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ =
         i_p._M_elems[2];
    pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
         i_p._M_elems[3];
    pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = i_p._M_elems[4];
    pu_00.encodingLabel._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = i_p._M_elems[5];
    pu_00.labelIsChange._M_t._M_impl._0_4_ = i_p._M_elems[6];
    pu_00.labelIsChange._M_t._M_impl._4_4_ = i_p._M_elems[7];
    pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._M_color = i_p._M_elems[8];
    pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = i_p._M_elems[9];
    pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         initial_patterns.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_start;
    pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         initial_patterns.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)
         initial_patterns.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pu_00.labelIsChange._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)output_file;
    pu_00.antecedentLabelsOfLabels._M_t._M_impl._0_8_ = min_confidence;
    pu_00.antecedentLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         min_anomaly_outlierness;
    pu_00.antecedentLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
         heuristic_mis;
    pu_00.antecedentLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_7_ = 0;
    pu_00.antecedentLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
         new_measures;
    pu_00.antecedentLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ = 0;
    pu_00.antecedentLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)
         init_pattern.
         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
         super__Vector_impl_data._M_start;
    pu_00.antecedentLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)init_pattern.
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    pu_00.dummyLabelsOfLabels._M_t._M_impl._0_8_ =
         init_pattern.
         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pu_00.dummyLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = uStack_870;
    pu_00.dummyLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    pu_00.dummyLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    pu_00.dummyLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)
         newedges.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    pu_00.dummyLabelsOfLabels._M_t._M_impl.super__Rb_tree_header._M_node_count = uStack_850;
    pu_00._296_8_ =
         starting_edges.
         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
         super__Vector_impl_data._M_start;
    pu_00.mappingSnapshotsToGraphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (starting_edges.
          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_elems;
    pu_00.mappingSnapshotsToGraphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (starting_edges.
          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)->_M_elems;
    pu_00.mappingSnapshotsToGraphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)uStack_830;
    pu_00._328_8_ =
         antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    pu_00.rawAdjacencyLists.
    super__Vector_base<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    pu_00.rawAdjacencyLists.
    super__Vector_base<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    pu_00.rawAdjacencyLists.
    super__Vector_base<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puStack_810;
    DGRSubgraphMining(&adjacency_lists,graph_ids,
                      (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                      &init_pattern.
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      ,iVar4,(vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *
                             )&starting_edges.
                               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                      ,&results,&results_anomalies,max_absolute_support_00,min_confidence,
                      compute_confidence,pu_00,
                      initial_patterns_occurrences.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      initial_patterns_occurrences.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish._0_1_,
                      initial_patterns_occurrences.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,
                      min_anomaly_outlierness,_adjacency_lists,(bool)in_stack_fffffffffffff830,
                      (bool)in_stack_fffffffffffff838,(bool)in_stack_fffffffffffff840);
    std::__cxx11::string::~string(local_738);
    PartialUnion::~PartialUnion(&local_198);
    std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~_Vector_base
              (&init_pattern.
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>);
    std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
              (&starting_edges.
                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>);
  }
  if (verbose) {
    println<char[10]>((char (*) [10])"FINISHED.");
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&antecedent_graph_ids.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&initial_patterns_occurrences);
  std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
            (&initial_patterns.
              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>);
  std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::~vector
            (&adjacency_lists);
  std::
  _Rb_tree<dgrminer::labeled_edge_with_occurrences,_dgrminer::labeled_edge_with_occurrences,_std::_Identity<dgrminer::labeled_edge_with_occurrences>,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~_Rb_tree(&edges_set._M_t);
  std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~_Vector_base
            (&newedges.
              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>);
  std::
  _Rb_tree<dgrminer::labeled_node_time,_dgrminer::labeled_node_time,_std::_Identity<dgrminer::labeled_node_time>,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  ::~_Rb_tree(&labeled_nodes._M_t);
LAB_00105216:
  PartialUnion::~PartialUnion(&pu);
  results_crate_anomalies::~results_crate_anomalies(&results_anomalies);
  results_crate::~results_crate(&results);
  return;
}

Assistant:

void run_DGRMiner(std::string input_file, std::string output_file, double min_support, double min_confidence,
					  bool compute_confidence, int window_size, std::string str_timeabstraction,
					  bool search_for_anomalies, double min_anomaly_outlierness, bool verbose, bool new_measures, bool heuristic_mis)
	{
		// set abstractions appropriately
		bool simple_time_abstraction = (str_timeabstraction == "bin_all");
		bool simple_node_time_abstraction = (str_timeabstraction == "bin_nodes");

		// save result patterns in the results_crate
		results_crate results;
		results_crate_anomalies results_anomalies;
		results.saved_instances = 0;
		results_anomalies.anomaly_saved_instances = 0;

		bool debugPrint = true;


		FileReader fr;
		PartialUnion pu;

		debug_println(verbose, "--- STARTING DGRMINER");
		debug_print(verbose, "--- READING FILE");
		pu = fr.read_dynamic_graph_from_file(input_file, window_size, search_for_anomalies);
		debug_println(verbose, "(DONE)");
		pu.printDimensions();
		debug_println(verbose, "Number of dynamic graphs: ", pu.getNumberOfDynamicGraphs());

	  	pu.setNewMeasuresAndHeuristics(new_measures, heuristic_mis);

		bool set_of_graphs = pu.getNumberOfDynamicGraphs() > 1;

		if (pu.getNumberOfNodes() == 0)
		{
			debug_println(verbose, "The union graph has no nodes! Quitting...");
			return;
		}

		int snapshots = pu.getNumberOfSnapshots();
		int max_absolute_support = snapshots;
		if (set_of_graphs && !new_measures) {
			max_absolute_support = pu.queryMappingSnapshotsToGraphs(snapshots - 1) + 1;
		}

	  	if (!new_measures) {
		  	min_support = max_absolute_support * min_support;
		}

	  	// what is the minimum support expressed by an absolute value
		auto min_absolute_support = (int) ceil(min_support);

		debug_println(verbose, "Max absolute support: ", max_absolute_support);
		debug_println(verbose, "Number of snapshots: ", snapshots);
		debug_println(verbose, "Min support (absolute): ", min_absolute_support);

		if (simple_time_abstraction)
		{
			pu.performSimpleTimeAbstraction();
		}
		else if (simple_node_time_abstraction)
		{
			pu.performSimpleNodeTimeAbstraction();
		}

		// we cannot remove infrequent vertices and edges if we are computing confidence (= if we are computing antecedents!!!! - also when computing anomalies)
		if (!compute_confidence)
		{
			debug_println(verbose, "--- REMOVING INFREQUENT VERTICES");
		}

		// compute the frequent vertices and remove the infrequent ones,
        // save the frequent ones into results
		pu.computeFrequentVerticesAndRemoveTheInfrequentOnes(min_absolute_support, min_confidence, compute_confidence,
															 &results, &results_anomalies, max_absolute_support,
															 set_of_graphs,
															 search_for_anomalies, min_anomaly_outlierness);
		if (!compute_confidence)
		{
			debug_println(verbose, "--- (DONE)");
			debug_println(verbose, "--- REMOVING INVALID EDGES");
		}


		std::set<labeled_node_time> labeled_nodes = pu.compute_labeled_nodes();
		if (!compute_confidence)
		{
			pu.eraseInvalidEdges(labeled_nodes);
			debug_println(verbose, "--- (DONE)");

			// remove infrequent edges
			debug_println(verbose, "--- REMOVING INFREQUENT EDGES");
		}

		std::vector<std::array<int, 8>> newedges;  // will be used for adjacency info
		std::set<labeled_edge_with_occurrences> edges_set; // this contains edges flipped to be smaller, used for counting support of the edges
		pu.compute_labeled_edges(newedges, edges_set, labeled_nodes, debugPrint); // computes newedges, edges_set

		if (!compute_confidence)
		{
			pu.removeInfrequentEdges(newedges, edges_set, min_absolute_support, set_of_graphs, debugPrint);
			debug_println(verbose, "--- (DONE)");
		}

		// build adjacency lists (one list for each snapshot):
		debug_print(verbose, "--- BUILDING ADJACENCY LISTS ");
		std::vector<AdjacencyListCrate> adjacency_lists = pu.createAdjacencyLists(newedges, snapshots);
		debug_println(verbose, "(DONE)");


		// create initial patterns:
		debug_print(verbose, "--- GETTING INITIAL PATTERNS ");
		std::vector<std::array<int, 8>> initial_patterns;
		std::vector<std::vector<int>> initial_patterns_occurrences;
		getFrequentInitialPatterns(edges_set, initial_patterns, initial_patterns_occurrences, min_absolute_support,
								   set_of_graphs, pu); // fills initial_patterns, initial_patterns_occurrences
		debug_println(verbose, "(DONE)");


		vector<int> antecedent_graph_ids;
		for (int i = 0; i < snapshots; i++)
		{
			antecedent_graph_ids.push_back(i);

		}

		debug_println(verbose, "--- FINDING FREQUENT PATTERNS (STARTING FROM ", initial_patterns.size(),
					  " INITIAL PATTERNS):");
		debug_println(verbose, "--- (", results.result_nodes.size(), " SINGLE-VERTEX PATTERNS ALREADY FOUND)");

		printResultsToFiles(&results, &results_anomalies, pu, output_file, set_of_graphs, compute_confidence,
							search_for_anomalies, false);


		for (size_t i = 0; i < initial_patterns.size(); i++)
		{
			std::vector<std::array<int, 8>> starting_edges;
			for (size_t j = 0; j <= i; j++)
			{
				starting_edges.push_back(initial_patterns[j]);
			}
			std::vector<std::array<int, 10>> init_pattern;
			std::array<int, 10> i_p = {
					0,
					1,
					initial_patterns[i][0],
					initial_patterns[i][1],
					initial_patterns[i][2],
					initial_patterns[i][3],
					initial_patterns[i][4],
					initial_patterns[i][5],
					initial_patterns[i][6],
					initial_patterns[i][7]
			};

			init_pattern.push_back(i_p);

			DGRSubgraphMining(adjacency_lists, initial_patterns_occurrences[i], init_pattern, min_absolute_support,
							  starting_edges, &results, &results_anomalies,
							  max_absolute_support, min_confidence, compute_confidence, pu, antecedent_graph_ids,
							  set_of_graphs, search_for_anomalies, min_anomaly_outlierness, output_file, verbose, new_measures,
							  heuristic_mis);
		}

		debug_println(verbose, "FINISHED.");
	}